

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

bool __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
try_seek(iterator *this,art_key_type search_key,bool *match,bool fwd)

{
  long *plVar1;
  atomic<long> *paVar2;
  bool *this_00;
  long lVar3;
  ulong uVar4;
  undefined1 uVar5;
  bool bVar6;
  value_type vVar7;
  value_type vVar8;
  uint uVar9;
  int iVar10;
  node_ptr nVar11;
  stack_entry *psVar12;
  undefined7 in_register_00000009;
  void *extraout_RDX;
  basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *this_01;
  node_type nVar13;
  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *pbVar14;
  olc_node_ptr aleaf;
  byte bVar15;
  find_result fVar16;
  undefined1 local_e0 [8];
  iter_result_opt cnxt;
  undefined1 local_b8 [8];
  iter_result_opt nxt;
  key_prefix_snapshot key_prefix;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_80;
  art_key_type remaining_key;
  undefined1 local_70 [8];
  read_critical_section c_critical_section;
  undefined1 auStack_58 [8];
  read_critical_section node_critical_section;
  read_critical_section parent_critical_section;
  
  remaining_key.field_0.key._4_4_ = (undefined4)CONCAT71(in_register_00000009,fwd);
  invalidate(this);
  *match = false;
  cnxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>.
  _M_payload.
  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>._24_8_ =
       match;
  optimistic_lock::try_read_lock((optimistic_lock *)&node_critical_section.version);
  if (node_critical_section.version.version != 0) {
    aleaf.tagged_ptr = (this->db_->root).value._M_i.tagged_ptr;
    if (aleaf.tagged_ptr == 0) {
      if (*(long *)(node_critical_section.version.version + 8) < 1) {
LAB_00120a7f:
        __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
      }
      bVar15 = parent_critical_section.lock ==
               *(optimistic_lock **)node_critical_section.version.version;
      if ((bool)bVar15) {
        LOCK();
        plVar1 = (long *)(node_critical_section.version.version + 8);
        lVar3 = *plVar1;
        *plVar1 = *plVar1 + -1;
        UNLOCK();
        if (SBORROW8(lVar3,1) != *plVar1 < 0) {
LAB_00120a9e:
          __assert_fail("old_value > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                        ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
        }
      }
      else {
        optimistic_lock::dec_read_lock_count
                  ((optimistic_lock *)node_critical_section.version.version);
      }
      node_critical_section.version.version = 0;
      goto LAB_00120a2f;
    }
    bVar6 = optimistic_lock::read_critical_section::check
                      ((read_critical_section *)&node_critical_section.version);
    if (bVar6) {
      parent_critical_section.version.version._4_4_ = search_key.field_0._0_4_;
      local_80 = search_key.field_0;
LAB_0012025e:
      if (aleaf.tagged_ptr == 0) {
        __assert_fail("node != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                      ,0x90a,
                      "bool unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::try_seek(art_key_type, bool &, bool) [Key = unsigned long, Value = std::span<const std::byte>]"
                     );
      }
      this_01 = (basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)
                (aleaf.tagged_ptr & 0xfffffffffffffff8);
      optimistic_lock::try_read_lock((optimistic_lock *)auStack_58);
      if ((auStack_58 != (undefined1  [8])0x0) &&
         (bVar6 = optimistic_lock::read_critical_section::check
                            ((read_critical_section *)&node_critical_section.version), bVar6)) {
        nVar13 = (node_type)aleaf.tagged_ptr & (I256|I48);
        if ((aleaf.tagged_ptr & 7) != 0) {
          uVar4._0_4_ = this_01->key_size;
          uVar4._4_4_ = this_01->value_size;
          this_00 = &nxt.
                     super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                     ._M_engaged;
          nxt.
          super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
          _24_8_ = uVar4;
          uVar9 = detail::key_prefix_snapshot::get_shared_length
                            ((key_prefix_snapshot *)this_00,local_80.key);
          if (uVar9 < (byte)((uint)uVar4._4_4_ >> 0x18)) {
            vVar7 = detail::basic_art_key<unsigned_long>::operator[]
                              ((basic_art_key<unsigned_long> *)&local_80.key_bytes,(ulong)uVar9);
            vVar8 = detail::key_prefix_snapshot::operator[]
                              ((key_prefix_snapshot *)this_00,(ulong)uVar9);
            if (vVar7 == vVar8) {
              __assert_fail("cmp_ != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                            ,0x93b,
                            "bool unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::try_seek(art_key_type, bool &, bool) [Key = unsigned long, Value = std::span<const std::byte>]"
                           );
            }
            if (remaining_key.field_0.key_bytes._M_elems[4] == 0) {
              if (vVar8 <= vVar7) {
                bVar6 = try_right_most_traversal
                                  (this,aleaf,
                                   (read_critical_section *)&node_critical_section.version);
                goto LAB_001205b0;
              }
              bVar6 = try_left_most_traversal
                                (this,aleaf,(read_critical_section *)&node_critical_section.version)
              ;
              bVar6 = unlock_and_return((read_critical_section *)auStack_58,bVar6);
              if (bVar6) {
                bVar6 = try_prior(this);
                parent_critical_section.version.version._4_4_ = (uint)bVar6;
                goto LAB_001205bf;
              }
            }
            else {
              if (vVar7 < vVar8) {
                bVar6 = try_left_most_traversal
                                  (this,aleaf,
                                   (read_critical_section *)&node_critical_section.version);
LAB_001205b0:
                bVar6 = unlock_and_return((read_critical_section *)auStack_58,bVar6);
                parent_critical_section.version.version._4_4_ = (uint)bVar6;
                goto LAB_001205bf;
              }
              bVar6 = try_right_most_traversal
                                (this,aleaf,(read_critical_section *)&node_critical_section.version)
              ;
              bVar6 = unlock_and_return((read_critical_section *)auStack_58,bVar6);
              if (bVar6) {
                bVar6 = try_next(this);
                parent_critical_section.version.version._4_4_ = (uint)bVar6;
                goto LAB_001205bf;
              }
            }
            goto LAB_001209d4;
          }
          c_critical_section.version.version = aleaf.tagged_ptr;
          detail::basic_art_key<unsigned_long>::shift_right
                    ((basic_art_key<unsigned_long> *)&local_80.key_bytes,uVar4 >> 0x38);
          uVar5 = local_80.key_bytes._M_elems[0];
          fVar16 = detail::
                   basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                   ::find_child((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                 *)this_01,nVar13,local_80.key_bytes._M_elems[0]);
          if (fVar16.second ==
              (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *
              )0x0) {
            if (remaining_key.field_0.key_bytes._M_elems[4] == 0) {
              detail::
              basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
              ::lte_key_byte((iter_result_opt *)local_b8,
                             (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                              *)this_01,nVar13,uVar5);
              aleaf.tagged_ptr = (uintptr_t)c_critical_section.version;
              uVar5 = nxt.
                      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                      ._M_payload._M_value.node.tagged_ptr._1_1_;
              if (nxt.
                  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                  ._M_payload._16_1_ == '\0') {
                if (*(long *)(node_critical_section.version.version + 8) < 1) goto LAB_00120a7f;
                if (parent_critical_section.lock !=
                    *(optimistic_lock **)node_critical_section.version.version) {
LAB_001209f4:
                  aleaf.tagged_ptr = c_critical_section.version.version;
                  optimistic_lock::dec_read_lock_count
                            ((optimistic_lock *)node_critical_section.version.version);
                  node_critical_section.version.version = 0;
                  goto LAB_00120a20;
                }
                LOCK();
                plVar1 = (long *)(node_critical_section.version.version + 8);
                lVar3 = *plVar1;
                *plVar1 = *plVar1 + -1;
                UNLOCK();
                if (SBORROW8(lVar3,1) == *plVar1 < 0) {
                  node_critical_section.version.version = 0;
                  if ((((atomic<long> *)((long)auStack_58 + 8))->super___atomic_base<long>)._M_i < 1
                     ) goto LAB_00120a7f;
                  if (node_critical_section.lock != *(optimistic_lock **)auStack_58)
                  goto LAB_00120a16;
                  LOCK();
                  paVar2 = (atomic<long> *)((long)auStack_58 + 8);
                  lVar3 = (paVar2->super___atomic_base<long>)._M_i;
                  (paVar2->super___atomic_base<long>)._M_i =
                       (paVar2->super___atomic_base<long>)._M_i + -1;
                  UNLOCK();
                  if (SBORROW8(lVar3,1) == (paVar2->super___atomic_base<long>)._M_i < 0) {
                    auStack_58 = (undefined1  [8])0x0;
                    if ((this->stack_).c.
                        super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                        (this->stack_).c.
                        super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
                      pop(this);
                    }
                    do {
                      if ((this->stack_).c.
                          super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                          (this->stack_).c.
                          super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0012056d;
                      psVar12 = top(this);
                      uVar4 = (psVar12->super_iter_result).node.tagged_ptr;
                      pbVar14 = (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                 *)(uVar4 & 0xfffffffffffffff8);
                      c_critical_section.lock = (optimistic_lock *)psVar12->version;
                      LOCK();
                      paVar2 = &(pbVar14->super_header_type).m_lock.read_lock_count;
                      (paVar2->super___atomic_base<long>)._M_i =
                           (paVar2->super___atomic_base<long>)._M_i + 1;
                      UNLOCK();
                      local_70 = (undefined1  [8])pbVar14;
                      bVar6 = optimistic_lock::read_critical_section::check
                                        ((read_critical_section *)local_70);
                      if (bVar6) {
                        nVar13 = (node_type)uVar4;
                        detail::
                        basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                        ::prior((iter_result_opt *)local_e0,pbVar14,nVar13 & (I256|I48),
                                (psVar12->super_iter_result).child_index);
                        if (cnxt.
                            super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                            ._M_payload._16_1_ == '\x01') {
                          nVar11 = detail::
                                   basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                   ::get_child(pbVar14,nVar13 & (I256|I48),
                                               (psVar12->super_iter_result).child_index);
                          bVar6 = optimistic_lock::read_critical_section::check
                                            ((read_critical_section *)local_70);
                          if (bVar6) {
                            bVar6 = try_right_most_traversal
                                              (this,(olc_node_ptr)nVar11.tagged_ptr,
                                               (read_critical_section *)local_70);
                            parent_critical_section.version.version._4_4_ = (uint)bVar6;
                            bVar6 = false;
                          }
                          else {
                            bVar6 = false;
                            parent_critical_section.version.version._4_4_ = 0;
                          }
                        }
                        else {
                          pop(this);
                          if ((((header_type *)local_70)->m_lock).read_lock_count.
                              super___atomic_base<long>._M_i < 1) goto LAB_00120a7f;
                          bVar6 = c_critical_section.lock ==
                                  (optimistic_lock *)
                                  (((header_type *)local_70)->m_lock).version.version.
                                  super___atomic_base<unsigned_long>._M_i;
                          if (bVar6) {
                            LOCK();
                            paVar2 = &(((header_type *)local_70)->m_lock).read_lock_count;
                            lVar3 = (paVar2->super___atomic_base<long>)._M_i;
                            (paVar2->super___atomic_base<long>)._M_i =
                                 (paVar2->super___atomic_base<long>)._M_i + -1;
                            UNLOCK();
                            if (SBORROW8(lVar3,1) != (paVar2->super___atomic_base<long>)._M_i < 0)
                            goto LAB_00120a9e;
                          }
                          else {
                            optimistic_lock::dec_read_lock_count((optimistic_lock *)local_70);
                            parent_critical_section.version.version._4_4_ = 0;
                          }
                          local_70 = (undefined1  [8])0x0;
                        }
                      }
                      else {
                        bVar6 = false;
                        parent_critical_section.version.version._4_4_ = 0;
                      }
                      optimistic_lock::read_critical_section::~read_critical_section
                                ((read_critical_section *)local_70);
                    } while (bVar6);
                    goto LAB_001205bf;
                  }
                }
                goto LAB_00120a9e;
              }
              nVar11 = detail::
                       basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                       ::get_child((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                    *)this_01,nVar13,
                                   nxt.
                                   super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                   ._M_payload.
                                   super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                   ._M_payload._M_value.node.tagged_ptr._1_1_);
              bVar6 = optimistic_lock::read_critical_section::check
                                ((read_critical_section *)auStack_58);
              if (bVar6) {
                if (*(long *)(node_critical_section.version.version + 8) < 1) goto LAB_00120a7f;
                if (parent_critical_section.lock !=
                    *(optimistic_lock **)node_critical_section.version.version) goto LAB_00120a00;
                LOCK();
                plVar1 = (long *)(node_critical_section.version.version + 8);
                lVar3 = *plVar1;
                *plVar1 = *plVar1 + -1;
                UNLOCK();
                if (SBORROW8(lVar3,1) != *plVar1 < 0) goto LAB_00120a9e;
                node_critical_section.version.version = 0;
                bVar6 = try_push(this,(olc_node_ptr)c_critical_section.version.version,
                                 nxt.
                                 super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                 ._M_payload._M_value.node.tagged_ptr._0_1_,uVar5,
                                 (key_prefix_snapshot)
                                 nxt.
                                 super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                 ._M_payload._8_8_,(read_critical_section *)auStack_58);
                if (bVar6) {
                  bVar6 = try_right_most_traversal
                                    (this,(olc_node_ptr)nVar11.tagged_ptr,
                                     (read_critical_section *)auStack_58);
                  parent_critical_section.version.version._4_4_ = (uint)bVar6;
                  aleaf.tagged_ptr = (uintptr_t)c_critical_section.version;
                  goto LAB_001205bf;
                }
              }
            }
            else {
              detail::
              basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
              ::gte_key_byte((iter_result_opt *)local_b8,
                             (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                              *)this_01,nVar13,uVar5);
              aleaf.tagged_ptr = (uintptr_t)c_critical_section.version;
              uVar5 = nxt.
                      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                      ._M_payload._M_value.node.tagged_ptr._1_1_;
              if (nxt.
                  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                  ._M_payload._16_1_ == '\0') {
                if (*(long *)(node_critical_section.version.version + 8) < 1) goto LAB_00120a7f;
                if (parent_critical_section.lock !=
                    *(optimistic_lock **)node_critical_section.version.version) goto LAB_001209f4;
                LOCK();
                plVar1 = (long *)(node_critical_section.version.version + 8);
                lVar3 = *plVar1;
                *plVar1 = *plVar1 + -1;
                UNLOCK();
                if (SBORROW8(lVar3,1) == *plVar1 < 0) {
                  node_critical_section.version.version = 0;
                  if ((((atomic<long> *)((long)auStack_58 + 8))->super___atomic_base<long>)._M_i < 1
                     ) goto LAB_00120a7f;
                  if (node_critical_section.lock != *(optimistic_lock **)auStack_58) {
LAB_00120a16:
                    aleaf.tagged_ptr = c_critical_section.version.version;
                    node_critical_section.version.version = 0;
                    optimistic_lock::dec_read_lock_count((optimistic_lock *)auStack_58);
                    auStack_58 = (undefined1  [8])0x0;
LAB_00120a20:
                    parent_critical_section.version.version._4_4_ = 0;
                    goto LAB_001205bf;
                  }
                  LOCK();
                  paVar2 = (atomic<long> *)((long)auStack_58 + 8);
                  lVar3 = (paVar2->super___atomic_base<long>)._M_i;
                  (paVar2->super___atomic_base<long>)._M_i =
                       (paVar2->super___atomic_base<long>)._M_i + -1;
                  UNLOCK();
                  if (SBORROW8(lVar3,1) == (paVar2->super___atomic_base<long>)._M_i < 0) {
                    auStack_58 = (undefined1  [8])0x0;
                    if ((this->stack_).c.
                        super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                        (this->stack_).c.
                        super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
                      pop(this);
                    }
                    do {
                      if ((this->stack_).c.
                          super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                          (this->stack_).c.
                          super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0012056d;
                      psVar12 = top(this);
                      uVar4 = (psVar12->super_iter_result).node.tagged_ptr;
                      pbVar14 = (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                 *)(uVar4 & 0xfffffffffffffff8);
                      c_critical_section.lock = (optimistic_lock *)psVar12->version;
                      LOCK();
                      paVar2 = &(pbVar14->super_header_type).m_lock.read_lock_count;
                      (paVar2->super___atomic_base<long>)._M_i =
                           (paVar2->super___atomic_base<long>)._M_i + 1;
                      UNLOCK();
                      local_70 = (undefined1  [8])pbVar14;
                      bVar6 = optimistic_lock::read_critical_section::check
                                        ((read_critical_section *)local_70);
                      if (bVar6) {
                        nVar13 = (node_type)uVar4;
                        detail::
                        basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                        ::next((iter_result_opt *)local_e0,pbVar14,nVar13 & (I256|I48),
                               (psVar12->super_iter_result).child_index);
                        if (cnxt.
                            super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                            ._M_payload._16_1_ == '\x01') {
                          nVar11 = detail::
                                   basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                   ::get_child(pbVar14,nVar13 & (I256|I48),
                                               (psVar12->super_iter_result).child_index);
                          bVar6 = optimistic_lock::read_critical_section::check
                                            ((read_critical_section *)local_70);
                          if (bVar6) {
                            bVar6 = try_left_most_traversal
                                              (this,(olc_node_ptr)nVar11.tagged_ptr,
                                               (read_critical_section *)local_70);
                            parent_critical_section.version.version._4_4_ = (uint)bVar6;
                            bVar6 = false;
                          }
                          else {
                            bVar6 = false;
                            parent_critical_section.version.version._4_4_ = 0;
                          }
                        }
                        else {
                          pop(this);
                          if ((((header_type *)local_70)->m_lock).read_lock_count.
                              super___atomic_base<long>._M_i < 1) goto LAB_00120a7f;
                          bVar6 = c_critical_section.lock ==
                                  (optimistic_lock *)
                                  (((header_type *)local_70)->m_lock).version.version.
                                  super___atomic_base<unsigned_long>._M_i;
                          if (bVar6) {
                            LOCK();
                            paVar2 = &(((header_type *)local_70)->m_lock).read_lock_count;
                            lVar3 = (paVar2->super___atomic_base<long>)._M_i;
                            (paVar2->super___atomic_base<long>)._M_i =
                                 (paVar2->super___atomic_base<long>)._M_i + -1;
                            UNLOCK();
                            if (SBORROW8(lVar3,1) != (paVar2->super___atomic_base<long>)._M_i < 0)
                            goto LAB_00120a9e;
                          }
                          else {
                            optimistic_lock::dec_read_lock_count((optimistic_lock *)local_70);
                            parent_critical_section.version.version._4_4_ = 0;
                          }
                          local_70 = (undefined1  [8])0x0;
                        }
                      }
                      else {
                        bVar6 = false;
                        parent_critical_section.version.version._4_4_ = 0;
                      }
                      optimistic_lock::read_critical_section::~read_critical_section
                                ((read_critical_section *)local_70);
                    } while (bVar6);
                    goto LAB_001205bf;
                  }
                }
                goto LAB_00120a9e;
              }
              nVar11 = detail::
                       basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                       ::get_child((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                    *)this_01,nVar13,
                                   nxt.
                                   super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                   ._M_payload.
                                   super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                   ._M_payload._M_value.node.tagged_ptr._1_1_);
              bVar6 = optimistic_lock::read_critical_section::check
                                ((read_critical_section *)auStack_58);
              if (bVar6) {
                if (*(long *)(node_critical_section.version.version + 8) < 1) goto LAB_00120a7f;
                if (parent_critical_section.lock ==
                    *(optimistic_lock **)node_critical_section.version.version) {
                  LOCK();
                  plVar1 = (long *)(node_critical_section.version.version + 8);
                  lVar3 = *plVar1;
                  *plVar1 = *plVar1 + -1;
                  UNLOCK();
                  if (SBORROW8(lVar3,1) != *plVar1 < 0) goto LAB_00120a9e;
                  node_critical_section.version.version = 0;
                  bVar6 = try_push(this,(olc_node_ptr)c_critical_section.version.version,
                                   nxt.
                                   super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                   ._M_payload.
                                   super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                   ._M_payload._M_value.node.tagged_ptr._0_1_,uVar5,
                                   (key_prefix_snapshot)
                                   nxt.
                                   super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                   ._M_payload.
                                   super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                   ._M_payload._8_8_,(read_critical_section *)auStack_58);
                  if (bVar6) {
                    bVar6 = try_left_most_traversal
                                      (this,(olc_node_ptr)nVar11.tagged_ptr,
                                       (read_critical_section *)auStack_58);
                    parent_critical_section.version.version._4_4_ = (uint)bVar6;
                    aleaf.tagged_ptr = (uintptr_t)c_critical_section.version;
                    goto LAB_001205bf;
                  }
                }
                else {
LAB_00120a00:
                  optimistic_lock::dec_read_lock_count
                            ((optimistic_lock *)node_critical_section.version.version);
                  node_critical_section.version.version = 0;
                }
              }
            }
            parent_critical_section.version.version._4_4_ = 0;
            aleaf.tagged_ptr = c_critical_section.version.version;
LAB_001205bf:
            bVar6 = false;
          }
          else {
            bVar6 = try_push(this,(olc_node_ptr)c_critical_section.version.version,uVar5,
                             fVar16.first,
                             (key_prefix_snapshot)
                             nxt.
                             super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                             ._24_8_,(read_critical_section *)auStack_58);
            if (bVar6) {
              aleaf.tagged_ptr = ((fVar16.second)->value)._M_i.tagged_ptr;
              local_80.key = local_80.key >> 8;
              bVar6 = optimistic_lock::read_critical_section::check
                                ((read_critical_section *)auStack_58);
              if (!bVar6) goto LAB_001209d4;
              node_critical_section.version.version = (version_tag_type)auStack_58;
              parent_critical_section.lock = node_critical_section.lock;
              auStack_58 = (undefined1  [8])0x0;
              bVar6 = true;
            }
            else {
              bVar6 = false;
              parent_critical_section.version.version._4_4_ = 0;
              aleaf.tagged_ptr = (uintptr_t)c_critical_section.version;
            }
          }
          goto LAB_001205c1;
        }
        if (*(long *)(node_critical_section.version.version + 8) < 1) goto LAB_00120a7f;
        if (parent_critical_section.lock ==
            *(optimistic_lock **)node_critical_section.version.version) {
          LOCK();
          plVar1 = (long *)(node_critical_section.version.version + 8);
          lVar3 = *plVar1;
          *plVar1 = *plVar1 + -1;
          UNLOCK();
          if (SBORROW8(lVar3,1) != *plVar1 < 0) goto LAB_00120a9e;
          node_critical_section.version.version = 0;
          bVar6 = try_push_leaf(this,aleaf,(read_critical_section *)auStack_58);
          if (!bVar6) goto LAB_001209d4;
          iVar10 = detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::cmp
                             (this_01,(void *)search_key.field_0,extraout_RDX);
          if ((((atomic<long> *)((long)auStack_58 + 8))->super___atomic_base<long>)._M_i < 1)
          goto LAB_00120a7f;
          if (node_critical_section.lock == *(optimistic_lock **)auStack_58) {
            LOCK();
            paVar2 = (atomic<long> *)((long)auStack_58 + 8);
            lVar3 = (paVar2->super___atomic_base<long>)._M_i;
            (paVar2->super___atomic_base<long>)._M_i = (paVar2->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar3,1) == (paVar2->super___atomic_base<long>)._M_i < 0) {
              auStack_58 = (undefined1  [8])0x0;
              if (iVar10 == 0) {
                *(undefined1 *)
                 cnxt.
                 super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                 ._24_8_ = 1;
LAB_0012056d:
                parent_critical_section.version.version._4_4_ = 1;
              }
              else if (remaining_key.field_0.key_bytes._M_elems[4] == 0) {
                if (0 < iVar10) goto LAB_0012056d;
                bVar6 = try_prior(this);
                parent_critical_section.version.version._4_4_ = (uint)bVar6;
              }
              else {
                if (iVar10 < 0) goto LAB_0012056d;
                bVar6 = try_next(this);
                parent_critical_section.version.version._4_4_ = (uint)bVar6;
              }
              goto LAB_001205bf;
            }
            goto LAB_00120a9e;
          }
          optimistic_lock::dec_read_lock_count((optimistic_lock *)auStack_58);
          auStack_58 = (undefined1  [8])0x0;
        }
        else {
          optimistic_lock::dec_read_lock_count
                    ((optimistic_lock *)node_critical_section.version.version);
          node_critical_section.version.version = 0;
        }
      }
LAB_001209d4:
      bVar6 = false;
      parent_critical_section.version.version._4_4_ = 0;
LAB_001205c1:
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)auStack_58);
      if (!bVar6) goto LAB_00120a2c;
      goto LAB_0012025e;
    }
  }
  bVar15 = 0;
  goto LAB_00120a2f;
LAB_00120a2c:
  bVar15 = (byte)parent_critical_section.version.version._4_4_;
LAB_00120a2f:
  optimistic_lock::read_critical_section::~read_critical_section
            ((read_critical_section *)&node_critical_section.version);
  return (bool)(bVar15 & 1);
}

Assistant:

bool olc_db<Key, Value>::iterator::try_seek(art_key_type search_key,
                                            bool& match, bool fwd) {
  invalidate();   // invalidate the iterator (clear the stack).
  match = false;  // unless we wind up with an exact match.
  auto parent_critical_section = db_.root_pointer_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(parent_critical_section.must_restart())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return false;
    // LCOV_EXCL_STOP
  }
  auto node{db_.root.load()};
  if (UNODB_DETAIL_UNLIKELY(node == nullptr)) {
    return UNODB_DETAIL_LIKELY(parent_critical_section.try_read_unlock());
  }
  // A check() is required before acting on [node] by taking the lock.
  if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return false;
    // LCOV_EXCL_STOP
  }
  const auto k = search_key;
  auto remaining_key{k};
  while (true) {
    UNODB_DETAIL_ASSERT(node != nullptr);
    // Lock version chaining (node and parent)
    auto node_critical_section = node_ptr_lock(node).try_read_lock();
    if (UNODB_DETAIL_UNLIKELY(node_critical_section.must_restart()))
      return false;  // LCOV_EXCL_LINE
    // TODO(thompsonbry) Should be redundant.  Checked before entering
    // the while() loop and at the bottom of the while() loop.
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) return false;
    // Note: We DO NOT unlock the parent_critical_section here.  It is
    // done below along all code paths.
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      if (UNODB_DETAIL_UNLIKELY(
              !parent_critical_section.try_read_unlock()))  // unlock parent
        return false;                                       // LCOV_EXCL_LINE
      const auto* const leaf{node.template ptr<leaf_type*>()};
      if (UNODB_DETAIL_UNLIKELY(!try_push_leaf(node, node_critical_section)))
        return false;  // LCOV_EXCL_LINE
      const auto cmp_ = leaf->cmp(k);
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return false;  // LCOV_EXCL_LINE
      if (cmp_ == 0) {
        match = true;
        return true;  // done
      }
      if (fwd) {  // GTE semantics
        // if search_key < leaf, use leaf, else next().
        return (cmp_ < 0) ? true : try_next();
      }
      // LTE semantics: if search_key > leaf, use leaf, else prior().
      return (cmp_ > 0) ? true : try_prior();
    }
    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);
    auto* const inode{node.template ptr<inode_type*>()};  // some internal node.
    const auto key_prefix{inode->get_key_prefix().get_snapshot()};  // prefix
    const auto key_prefix_length{key_prefix.length()};  // length of that prefix
    const auto shared_length = key_prefix.get_shared_length(
        remaining_key.get_u64());  // #of prefix bytes matched.
    if (shared_length < key_prefix_length) {
      // We have visited an internal node whose prefix is longer than
      // the bytes in the key that we need to match.  To figure out
      // whether the search key would be located before or after the
      // current internal node, we need to compare the respective key
      // spans lexicographically.  Since we have [shared_length] bytes
      // in common, we know that the next byte will tell us the
      // relative ordering of the key vs the prefix. So now we compare
      // prefix and key and the first byte where they differ.
      const auto cmp_ = static_cast<int>(remaining_key[shared_length]) -
                        static_cast<int>(key_prefix[shared_length]);
      UNODB_DETAIL_ASSERT(cmp_ != 0);
      if (fwd) {
        // Note: parent_critical_section is unlocked along all paths
        // by try_(left|right)_most_traversal
        if (cmp_ < 0) {
          // FWD and the search key is ordered before this node.  We
          // want the left-most leaf under the node.
          return unlock_and_return(
              node_critical_section,
              try_left_most_traversal(node, parent_critical_section));
        }
        // FWD and the search key is ordered after this node.  Right
        // most descent and then next().
        return unlock_and_return(
                   node_critical_section,
                   try_right_most_traversal(node, parent_critical_section)) &&
               try_next();
      }
      // reverse traversal
      if (cmp_ < 0) {
        // REV and the search key is ordered before this node.  We
        // want the preceeding key.
        return unlock_and_return(
                   node_critical_section,
                   try_left_most_traversal(node, parent_critical_section)) &&
               try_prior();
      }
      // REV and the search key is ordered after this node.
      return unlock_and_return(
          node_critical_section,
          try_right_most_traversal(node, parent_critical_section));
    }
    remaining_key.shift_right(key_prefix_length);
    const auto res = inode->find_child(node_type, remaining_key[0]);
    if (res.second == nullptr) {
      // We are on a key byte during the descent that is not mapped by
      // the current node.  Where we go next depends on whether we are
      // doing forward or reverse traversal.
      if (fwd) {
        // FWD: Take the next child_index that is mapped in the data
        // and then do a left-most descent to land on the key that is
        // the immediate successor of the desired key in the data.
        //
        // Note: We are probing with a key byte which does not appear
        // in our list of keys (this was verified above) so this will
        // always be the index the first entry whose key byte is
        // greater-than the probe value and [false] if there is no
        // such entry.
        //
        // Note: [node] has not been pushed onto the stack yet!
        auto nxt = inode->gte_key_byte(node_type, remaining_key[0]);
        if (!nxt) {
          // Pop entries off the stack until we find one with a
          // right-sibling of the path we took to this node and then
          // do a left-most descent under that right-sibling. If there
          // is no such parent, we will wind up with an empty stack
          // (aka the end() iterator) and return that state.
          if (UNODB_DETAIL_UNLIKELY(
                  !parent_critical_section.try_read_unlock()))  // unlock parent
            return false;  // LCOV_EXCL_LINE
          if (UNODB_DETAIL_UNLIKELY(
                  !node_critical_section.try_read_unlock()))  // unlock node
            return false;                                     // LCOV_EXCL_LINE
          if (!empty()) pop();
          while (!empty()) {
            const auto& centry = top();
            const auto cnode{centry.node};  // a possible parent from the stack.
            auto c_critical_section(
                node_ptr_lock(cnode).rehydrate_read_lock(centry.version));
            if (UNODB_DETAIL_UNLIKELY(!c_critical_section.check()))
              return false;  // LCOV_EXCL_LINE
            auto* const icnode{cnode.template ptr<inode_type*>()};
            const auto cnxt = icnode->next(
                cnode.type(), centry.child_index);  // right-sibling.
            if (cnxt) {
              auto nchild = icnode->get_child(
                  cnode.type(), centry.child_index);  // get the child
              if (UNODB_DETAIL_UNLIKELY(
                      !c_critical_section.check()))  // before using [nchild]
                return false;                        // LCOV_EXCL_LINE
              return try_left_most_traversal(nchild, c_critical_section);
            }
            pop();
            if (UNODB_DETAIL_UNLIKELY(!c_critical_section.try_read_unlock()))
              return false;  // LCOV_EXCL_LINE
          }
          return true;  // stack is empty (aka end()).
        }
        const auto& tmp = nxt.value();  // unwrap.
        const auto child_index = tmp.child_index;
        const auto child =
            inode->get_child(node_type, child_index);  // get child
        if (UNODB_DETAIL_UNLIKELY(
                !node_critical_section.check()))  // before using [child]
          return false;                           // LCOV_EXCL_LINE
        if (UNODB_DETAIL_UNLIKELY(
                !parent_critical_section.try_read_unlock()))  // unlock parent
          return false;                                       // LCOV_EXCL_LINE
        // push the path we took
        if (UNODB_DETAIL_UNLIKELY(!try_push(node, tmp.key_byte, child_index,
                                            tmp.prefix, node_critical_section)))
          return false;  // LCOV_EXCL_LINE
        return try_left_most_traversal(child, node_critical_section);
      }
      // REV: Take the prior child_index that is mapped and then do
      // a right-most descent to land on the key that is the
      // immediate precessor of the desired key in the data.
      auto nxt = inode->lte_key_byte(node_type, remaining_key[0]);
      if (!nxt) {
        // Pop off the current entry until we find one with a
        // left-sibling and then do a right-most descent under that
        // left-sibling.  In the extreme case there is no such
        // previous entry and we will wind up with an empty stack.
        if (UNODB_DETAIL_UNLIKELY(
                !parent_critical_section.try_read_unlock()))  // unlock parent
          return false;                                       // LCOV_EXCL_LINE
        if (UNODB_DETAIL_UNLIKELY(
                !node_critical_section.try_read_unlock()))  // unlock node
          return false;                                     // LCOV_EXCL_LINE
        if (!empty()) pop();
        while (!empty()) {
          const auto& centry = top();
          const auto cnode{centry.node};  // a possible parent from stack
          auto c_critical_section(
              node_ptr_lock(cnode).rehydrate_read_lock(centry.version));
          if (UNODB_DETAIL_UNLIKELY(!c_critical_section.check()))
            return false;  // LCOV_EXCL_LINE
          auto* const icnode{cnode.template ptr<inode_type*>()};
          const auto cnxt =
              icnode->prior(cnode.type(), centry.child_index);  // left-sibling.
          if (cnxt) {
            auto nchild = icnode->get_child(
                cnode.type(), centry.child_index);  // get the child
            if (UNODB_DETAIL_UNLIKELY(
                    !c_critical_section.check()))  // before using [nchild]
              return false;                        // LCOV_EXCL_LINE
            return try_right_most_traversal(nchild, c_critical_section);
          }
          pop();
          if (UNODB_DETAIL_UNLIKELY(!c_critical_section.try_read_unlock()))
            return false;  // LCOV_EXCL_LINE
        }
        return true;  // stack is empty (aka end()).
      }
      const auto& tmp = nxt.value();  // unwrap.
      const auto child_index = tmp.child_index;
      const auto child =
          inode->get_child(node_type, child_index);  // get the child
      if (UNODB_DETAIL_UNLIKELY(
              !node_critical_section.check()))  // before using [child]
        return false;                           // LCOV_EXCL_LINE
      if (UNODB_DETAIL_UNLIKELY(
              !parent_critical_section.try_read_unlock()))  // unlock parent
        return false;                                       // LCOV_EXCL_LINE
      // push the path we took
      if (UNODB_DETAIL_UNLIKELY(!try_push(node, tmp.key_byte, child_index,
                                          tmp.prefix, node_critical_section)))
        return false;  // LCOV_EXCL_LINE
      return try_right_most_traversal(child, node_critical_section);
    }
    // Simple case. There is a child for the current key byte.
    const auto child_index{res.first};
    const auto* const child{res.second};
    if (UNODB_DETAIL_UNLIKELY(!try_push(node, remaining_key[0], child_index,
                                        key_prefix, node_critical_section)))
      return false;  // LCOV_EXCL_LINE
    node = *child;
    remaining_key.shift_right(1);
    // check node before using [child] and before we std::move() the RCS.
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check()))
      return false;  // LCOV_EXCL_LINE
    // Move RCS (will check invariant at top of loop)
    parent_critical_section = std::move(node_critical_section);
  }  // while ( true )
  UNODB_DETAIL_CANNOT_HAPPEN();
}